

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

double ulp(U *x)

{
  U u;
  int32 L;
  U *x_local;
  
  return (double)((ulong)((x->L[1] & 0x7ff00000) + 0xfcc00000) << 0x20);
}

Assistant:

static double
ulp(U *x)
{
    Long L;
    U u;

    L = (word0(x) & Exp_mask) - (P-1)*Exp_msk1;
    word0(&u) = L;
    word1(&u) = 0;
    return dval(&u);
}